

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineWriter.cpp
# Opt level: O1

void __thiscall adios2::core::engine::InlineWriter::Flush(InlineWriter *this,int param_1)

{
  int iVar1;
  ostream *poVar2;
  undefined4 in_register_00000034;
  ScopedTimer __var2174;
  ScopedTimer local_10;
  
  if (Flush(int)::__var174 == '\0') {
    iVar1 = __cxa_guard_acquire(&Flush(int)::__var174,CONCAT44(in_register_00000034,param_1));
    if (iVar1 != 0) {
      Flush::__var174 = (void *)ps_timer_create_("InlineWriter::Flush");
      __cxa_guard_release(&Flush(int)::__var174);
    }
  }
  local_10.m_timer = Flush::__var174;
  if (_perfstubs_initialized == 1) {
    ps_timer_start_();
  }
  if (this->m_Verbosity == 5) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Inline Writer ",0xe);
    poVar2 = (ostream *)std::ostream::operator<<(&std::cout,this->m_WriterRank);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"   Flush()\n",0xb);
  }
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&local_10);
  return;
}

Assistant:

void InlineWriter::Flush(const int)
{
    PERFSTUBS_SCOPED_TIMER("InlineWriter::Flush");
    if (m_Verbosity == 5)
    {
        std::cout << "Inline Writer " << m_WriterRank << "   Flush()\n";
    }
}